

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

int luaD_protectedparser(lua_State *L,ZIO *z,char *name,char *mode)

{
  int iVar1;
  ZIO *local_78;
  void *local_70;
  size_t local_60;
  void *pvStack_58;
  int local_4c;
  void *local_48;
  int local_3c;
  void *local_38;
  int local_2c;
  char *local_28;
  char *local_20;
  
  L->nny = L->nny + 1;
  local_4c = 0;
  local_48 = (void *)0x0;
  local_3c = 0;
  local_38 = (void *)0x0;
  local_2c = 0;
  local_70 = (void *)0x0;
  local_60 = 0;
  pvStack_58 = (void *)0x0;
  local_78 = z;
  local_28 = mode;
  local_20 = name;
  iVar1 = luaD_pcall(L,f_parser,&local_78,(long)L->top - (long)L->stack,L->errfunc);
  local_70 = luaM_realloc_(L,local_70,local_60,0);
  local_60 = 0;
  luaM_realloc_(L,pvStack_58,(long)local_4c * 2,0);
  luaM_realloc_(L,local_48,(long)local_3c * 0x18,0);
  luaM_realloc_(L,local_38,(long)local_2c * 0x18,0);
  L->nny = L->nny - 1;
  return iVar1;
}

Assistant:

int luaD_protectedparser (lua_State *L, ZIO *z, const char *name,
                                        const char *mode) {
  struct SParser p;
  int status;
  L->nny++;  /* cannot yield during parsing */
  p.z = z; p.name = name; p.mode = mode;
  p.dyd.actvar.arr = NULL; p.dyd.actvar.size = 0;
  p.dyd.gt.arr = NULL; p.dyd.gt.size = 0;
  p.dyd.label.arr = NULL; p.dyd.label.size = 0;
  luaZ_initbuffer(L, &p.buff);
  status = luaD_pcall(L, f_parser, &p, savestack(L, L->top), L->errfunc);
  luaZ_freebuffer(L, &p.buff);
  luaM_freearray(L, p.dyd.actvar.arr, p.dyd.actvar.size);
  luaM_freearray(L, p.dyd.gt.arr, p.dyd.gt.size);
  luaM_freearray(L, p.dyd.label.arr, p.dyd.label.size);
  L->nny--;
  return status;
}